

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedQueue.h
# Opt level: O3

void __thiscall SynchronizedQueue<Buffer>::put(SynchronizedQueue<Buffer> *this,Buffer *value)

{
  _Map_pointer ppBVar1;
  __sighandler_t __handler;
  
  Semaphore::p((Semaphore *)this);
  std::deque<Buffer,_std::allocator<Buffer>_>::push_back(&(this->values).c,value);
  ppBVar1 = (this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  __handler = (__sighandler_t)
              (((long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur -
                (long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555);
  if (__handler +
      (((long)ppBVar1 -
        (long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
              super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppBVar1 == (_Map_pointer)0x0)) * 0x15 +
      ((long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Deque_impl_data._M_start._M_last -
       (long)(this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 ==
      (__sighandler_t)0x1) {
    Monitor::signal(&this->super_Monitor,(int)this + 0x70,__handler);
  }
  Semaphore::v((Semaphore *)this);
  return;
}

Assistant:

void SynchronizedQueue<T>::put(T value) {
    enter();
    values.push(value);
    if (values.size() == 1) {
        signal(isEmpty);
    }
    leave();
}